

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngTestFIPS1(octet *buf)

{
  size_t sVar1;
  long in_RDI;
  size_t count;
  size_t s;
  bool local_19;
  long local_18;
  ulong local_10;
  
  local_10 = u32Weight(*(u32 *)(in_RDI + 0x9c0));
  local_18 = 0x138;
  while (local_18 != 0) {
    sVar1 = u64Weight(*(u64 *)(in_RDI + (local_18 + -1) * 8));
    local_10 = sVar1 + local_10;
    local_18 = local_18 + -1;
  }
  local_19 = 0x25fd < local_10 && local_10 < 0x2823;
  return (bool_t)local_19;
}

Assistant:

bool_t rngTestFIPS1(const octet buf[2500])
{
	size_t s = 0;
	size_t count = W_OF_O(2500);
	ASSERT(memIsValid(buf, 2500));
	if (O_OF_W(count) > 2500)
	{
		ASSERT(B_PER_W == 64);
		s = u32Weight(*(const u32*)(buf + 2496));
		--count;
	}
	while (count--)
		s += wordWeight(((const word*)buf)[count]);
	return 9725 < s && s < 10275;
}